

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::Dynamic_Proxy_Function::test_guard
          (Dynamic_Proxy_Function *this,Function_Params *params,
          Type_Conversions_State *t_conversions)

{
  bool bVar1;
  element_type *params_00;
  arity_error *anon_var_0;
  bad_boxed_cast *anon_var_0_1;
  undefined1 local_38 [24];
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  Dynamic_Proxy_Function *this_local;
  
  local_38._16_8_ = t_conversions;
  t_conversions_local = (Type_Conversions_State *)params;
  params_local = (Function_Params *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_guard);
  if (bVar1) {
    params_00 = std::
                __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_guard);
    Proxy_Function_Base::operator()
              ((Proxy_Function_Base *)local_38,(Function_Params *)params_00,t_conversions_local);
    this_local._7_1_ = boxed_cast<bool>((Boxed_Value *)local_38,(Type_Conversions_State *)0x0);
    Boxed_Value::~Boxed_Value((Boxed_Value *)local_38);
  }
  else {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool test_guard(const Function_Params &params, const Type_Conversions_State &t_conversions) const {
        if (m_guard) {
          try {
            return boxed_cast<bool>((*m_guard)(params, t_conversions));
          } catch (const exception::arity_error &) {
            return false;
          } catch (const exception::bad_boxed_cast &) {
            return false;
          }
        } else {
          return true;
        }
      }